

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void dirINCTRD(void)

{
  bool bVar1;
  int iVar2;
  fullpath_ref_t trd;
  char *message;
  aint length;
  aint offset;
  aint val;
  string filename;
  aint local_64;
  aint local_60;
  int local_5c;
  long *local_58;
  long local_50;
  long local_48 [2];
  string local_38;
  
  local_60 = 0;
  local_64 = 0x7fffffff;
  trd = GetInputFile(&lp);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
  bVar1 = anyComma(&lp);
  if (bVar1) {
    bVar1 = anyComma(&lp);
    if (!bVar1) {
      GetDelimitedString_abi_cxx11_(&local_38,&lp);
      std::__cxx11::string::operator=((string *)&local_58,(string *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (local_50 == 0) {
LAB_0010e459:
    Error("[INCTRD] Syntax error",bp,IF_FIRST);
LAB_0010e474:
    SkipToEol(&lp);
  }
  else {
    bVar1 = anyComma(&lp);
    if (bVar1) {
      bVar1 = anyComma(&lp);
      if (!bVar1) {
        iVar2 = ParseExpressionNoSyntaxError(&lp,&local_5c);
        if (iVar2 == 0) goto LAB_0010e459;
        if (-1 < local_5c) {
          local_60 = local_5c;
          goto LAB_0010e3f7;
        }
        message = "[INCTRD] Negative offset value is not allowed";
LAB_0010e4b1:
        ErrorInt(message,local_5c,PASS3);
        goto LAB_0010e474;
      }
      lp = lp + -1;
LAB_0010e3f7:
      bVar1 = anyComma(&lp);
      if (bVar1) {
        iVar2 = ParseExpressionNoSyntaxError(&lp,&local_5c);
        if (iVar2 == 0) goto LAB_0010e459;
        if (local_5c < 0) {
          message = "[INCTRD] Negative length value is not allowed";
          goto LAB_0010e4b1;
        }
        local_64 = local_5c;
      }
    }
    iVar2 = TRD_PrepareIncFile(trd,(char *)local_58,&local_60,&local_64);
    if (iVar2 != 0) {
      BinIncFile(trd,local_60,local_64);
    }
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

static void dirINCTRD() {
	aint val, offset = 0, length = INT_MAX;
	fullpath_ref_t trdfile = GetInputFile(lp);
	std::string filename {""};
	if (anyComma(lp) && !anyComma(lp)) filename = GetDelimitedString(lp);
	if (filename.empty()) {
		// file-in-disk syntax error
		Error("[INCTRD] Syntax error", bp, IF_FIRST);
		SkipToEol(lp);
		return;
	}
	if (anyComma(lp)) {
		if (!anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCTRD] Syntax error", bp, IF_FIRST);
				SkipToEol(lp);
				return;
			}
			if (val < 0) {
				ErrorInt("[INCTRD] Negative offset value is not allowed", val);
				SkipToEol(lp);
				return;
			}
			offset = val;
		} else --lp;		// there was second comma right after, reread it
		if (anyComma(lp)) {
			if (!ParseExpressionNoSyntaxError(lp, val)) {
				Error("[INCTRD] Syntax error", bp, IF_FIRST);
				SkipToEol(lp);
				return;
			}
			if (val < 0) {
				ErrorInt("[INCTRD] Negative length value is not allowed", val);
				SkipToEol(lp);
				return;
			}
			length = val;
		}
	}
	if (TRD_PrepareIncFile(trdfile, filename.c_str(), offset, length)) {
		BinIncFile(trdfile, offset, length);
	}
}